

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_decoder.h
# Opt level: O1

bool __thiscall
draco::DirectBitDecoder::DecodeLeastSignificantBits32
          (DirectBitDecoder *this,int nbits,uint32_t *value)

{
  uint uVar1;
  uint *puVar2;
  uint32_t uVar3;
  byte bVar4;
  int iVar5;
  
  iVar5 = 0x20 - this->num_used_bits_;
  uVar3 = nbits - iVar5;
  bVar4 = (byte)this->num_used_bits_;
  if (uVar3 == 0 || nbits < iVar5) {
    puVar2 = (this->pos_)._M_current;
    if (puVar2 == (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    *value = (*puVar2 << (bVar4 & 0x1f)) >> (-(char)nbits & 0x1fU);
    uVar3 = nbits + this->num_used_bits_;
    this->num_used_bits_ = uVar3;
    if (uVar3 == 0x20) {
      (this->pos_)._M_current = puVar2 + 1;
      this->num_used_bits_ = 0;
      return true;
    }
  }
  else {
    puVar2 = (this->pos_)._M_current;
    if (puVar2 + 1 ==
        (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return false;
    }
    uVar1 = *puVar2;
    this->num_used_bits_ = uVar3;
    (this->pos_)._M_current = puVar2 + 1;
    *value = (uVar1 << (bVar4 & 0x1f)) >> (-(char)nbits & 0x1fU) |
             puVar2[1] >> (-(char)uVar3 & 0x1fU);
  }
  return true;
}

Assistant:

bool DecodeLeastSignificantBits32(int nbits, uint32_t *value) {
    DRACO_DCHECK_EQ(true, nbits <= 32);
    DRACO_DCHECK_EQ(true, nbits > 0);
    const int remaining = 32 - num_used_bits_;
    if (nbits <= remaining) {
      if (pos_ == bits_.end()) {
        return false;
      }
      *value = (*pos_ << num_used_bits_) >> (32 - nbits);
      num_used_bits_ += nbits;
      if (num_used_bits_ == 32) {
        ++pos_;
        num_used_bits_ = 0;
      }
    } else {
      if (pos_ + 1 == bits_.end()) {
        return false;
      }
      const uint32_t value_l = ((*pos_) << num_used_bits_);
      num_used_bits_ = nbits - remaining;
      ++pos_;
      const uint32_t value_r = (*pos_) >> (32 - num_used_bits_);
      *value = (value_l >> (32 - num_used_bits_ - remaining)) | value_r;
    }
    return true;
  }